

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOut.c
# Opt level: O1

int Gia_ManGlaRefine(Gia_Man_t *p,Abc_Cex_t *pCex,int fMinCut,int fVerbose)

{
  ulong *puVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  int iVar9;
  Gia_Man_t *pGVar10;
  Gia_Man_t *p_00;
  Abc_Cex_t *pAVar11;
  byte bVar12;
  ulong uVar13;
  Vec_Int_t *pVVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  undefined7 uVar19;
  int iVar20;
  ulong uVar21;
  long lVar22;
  Vec_Int_t *vPis;
  Vec_Int_t *vPPis;
  timespec ts;
  Vec_Int_t *local_60;
  int local_54;
  long local_50;
  Vec_Int_t *local_48;
  timespec local_40;
  
  iVar17 = 3;
  iVar9 = clock_gettime(3,&local_40);
  if (iVar9 < 0) {
    local_50 = 1;
  }
  else {
    lVar15 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_50 = ((lVar15 >> 7) - (lVar15 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->vGateClasses == (Vec_Int_t *)0x0) {
    Abc_Print(iVar17,"Gia_ManGlaRefine(): Abstraction gate map is missing.\n");
  }
  else {
    pGVar10 = Gia_ManDupAbsGates(p,p->vGateClasses);
    Gia_ManStop(pGVar10);
    pGVar10 = p;
    p_00 = Gia_ManDupAbsGates(p,p->vGateClasses);
    if (p_00->vCis->nSize - p_00->nRegs == pCex->nPis) {
      pGVar10 = p_00;
      local_54 = fMinCut;
      iVar9 = Gia_ManVerifyCex(p_00,pCex,0);
      if (iVar9 == 0) {
        Abc_Print((int)pGVar10,"Gia_ManGlaRefine(): The initial counter-example is invalid.\n");
      }
      pGVar10 = p;
      Gia_ManGlaCollect(p,p->vGateClasses,&local_60,&local_48,(Vec_Int_t **)0x0,(Vec_Int_t **)0x0);
      if (local_48->nSize + local_60->nSize != p_00->vCis->nSize - p_00->nRegs) {
        __assert_fail("Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                      ,0x7f,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
      }
      *(ulong *)p_00->pObjs = *(ulong *)p_00->pObjs & 0xbfffffffbfffffff | 0x40000000;
      if (-1 < pCex->iFrame) {
        iVar9 = 0;
        do {
          pVVar14 = p_00->vCis;
          uVar21 = (ulong)(uint)pVVar14->nSize;
          if (p_00->nRegs < pVVar14->nSize) {
            lVar15 = 0;
            do {
              if ((int)uVar21 <= lVar15) goto LAB_00591b55;
              iVar17 = pVVar14->pArray[lVar15];
              if (((long)iVar17 < 0) || (p_00->nObjs <= iVar17)) goto LAB_00591b36;
              pGVar10 = (Gia_Man_t *)p_00->pObjs;
              if (pGVar10 == (Gia_Man_t *)0x0) break;
              puVar1 = (ulong *)((long)&pGVar10->pName + (long)iVar17 * 0xc);
              if (lVar15 < local_60->nSize) {
                uVar18 = pCex->nPis * iVar9 + pCex->nRegs + (int)lVar15;
                if (((uint)(&pCex[1].iPo)[(int)uVar18 >> 5] >> (uVar18 & 0x1f) & 1) == 0) {
                  uVar21 = *puVar1 & 0xbfffffffbfffffff | 0x40000000;
                }
                else {
                  uVar21 = *puVar1 & 0xbfffffffbfffffff | 0x4000000000000000;
                }
              }
              else {
                uVar21 = *puVar1 | 0x4000000040000000;
              }
              *puVar1 = uVar21;
              lVar15 = lVar15 + 1;
              pVVar14 = p_00->vCis;
              uVar21 = (ulong)pVVar14->nSize;
              pGVar10 = (Gia_Man_t *)(long)p_00->nRegs;
            } while (lVar15 < (long)(uVar21 - (long)pGVar10));
          }
          iVar17 = p_00->nRegs;
          if (0 < iVar17) {
            iVar20 = 0;
            do {
              iVar3 = p_00->vCis->nSize;
              uVar18 = iVar20 + (iVar3 - iVar17);
              if (((int)uVar18 < 0) || (iVar3 <= (int)uVar18)) goto LAB_00591b55;
              pGVar10 = (Gia_Man_t *)p_00->vCis->pArray;
              iVar4 = *(int *)((long)&pGVar10->pName + (ulong)uVar18 * 4);
              if (((long)iVar4 < 0) || (p_00->nObjs <= iVar4)) goto LAB_00591b36;
              pGVar5 = p_00->pObjs;
              if (pGVar5 == (Gia_Obj_t *)0x0) break;
              pGVar2 = pGVar5 + iVar4;
              uVar21 = *(ulong *)pGVar2;
              if (iVar9 == 0) {
                pGVar10 = (Gia_Man_t *)(uVar21 & 0xbfffffffbfffffff | 0x40000000);
              }
              else {
                if (((~(uint)uVar21 & 0x9fffffff) != 0) ||
                   (uVar18 = (uint)(uVar21 >> 0x20) & 0x1fffffff, (int)uVar18 < iVar3 - iVar17)) {
                  __assert_fail("Gia_ObjIsRo(p, pObj)",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x1db,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
                }
                iVar17 = p_00->vCos->nSize;
                uVar18 = (iVar17 - iVar3) + uVar18;
                if (((int)uVar18 < 0) || (iVar17 <= (int)uVar18)) goto LAB_00591b55;
                iVar17 = p_00->vCos->pArray[uVar18];
                lVar15 = (long)iVar17;
                if ((lVar15 < 0) || (p_00->nObjs <= iVar17)) goto LAB_00591b36;
                if ((*(ulong *)(pGVar5 + lVar15) & 0x4000000040000000) == 0) {
                  __assert_fail("!Gia_ObjTerSimGetC( pTemp )",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x356,"void Gia_ObjTerSimRo(Gia_Man_t *, Gia_Obj_t *)");
                }
                uVar13 = *(ulong *)(pGVar5 + lVar15) & 0x40000000;
                *(ulong *)pGVar2 = uVar21 & 0xffffffffbfffffff | uVar13;
                pGVar10 = (Gia_Man_t *)
                          (uVar21 & 0xbfffffffbfffffff | uVar13 |
                          *(ulong *)(pGVar5 + lVar15) & 0x4000000000000000);
              }
              *(Gia_Man_t **)pGVar2 = pGVar10;
              iVar20 = iVar20 + 1;
              iVar17 = p_00->nRegs;
            } while (iVar20 < iVar17);
          }
          if (0 < p_00->nObjs) {
            lVar15 = 0;
            lVar22 = 0;
            do {
              pGVar5 = p_00->pObjs;
              if (pGVar5 == (Gia_Obj_t *)0x0) break;
              uVar21 = *(ulong *)(&pGVar5->field_0x0 + lVar15);
              uVar18 = (uint)uVar21;
              pGVar10 = (Gia_Man_t *)CONCAT71((int7)((ulong)pGVar10 >> 8),(int)uVar18 < 0);
              if ((uVar21 & 0x1fffffff) != 0x1fffffff && (int)uVar18 >= 0) {
                uVar13 = *(ulong *)((long)pGVar5 +
                                   lVar15 + (ulong)(uint)((int)(uVar21 & 0x1fffffff) << 2) * -3) &
                         0x4000000040000000;
                if (uVar13 == 0) {
                  __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x33e,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
                }
                pGVar10 = (Gia_Man_t *)
                          ((long)pGVar5 + (ulong)((uint)(uVar21 >> 0x1e) & 0x7ffffffc) * -3);
                uVar16 = *(ulong *)((long)&pGVar10->pName + lVar15) & 0x4000000040000000;
                if (uVar16 == 0) {
                  __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin1(pObj) )",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                                ,0x33f,"void Gia_ObjTerSimAnd(Gia_Obj_t *)");
                }
                if ((((((uVar18 >> 0x1d & 1) == 0) || (uVar13 != 0x4000000000000000)) &&
                     (((uVar18 >> 0x1d & 1) != 0 || (uVar13 != 0x40000000)))) &&
                    (((uVar21 >> 0x3d & 1) == 0 || (uVar16 != 0x4000000000000000)))) &&
                   (((uVar21 >> 0x3d & 1) != 0 || (uVar16 != 0x40000000)))) {
                  uVar19 = (undefined7)((ulong)pGVar10 >> 8);
                  pGVar10 = (Gia_Man_t *)CONCAT71(uVar19,uVar13 != 0x4000000000000000);
                  if ((((byte)(uVar21 >> 0x1d) & 1 & uVar13 == 0x40000000) != 0) ||
                     ((uVar21 >> 0x1d & 1) == 0 && uVar13 == 0x4000000000000000)) {
                    bVar12 = (byte)(uVar21 >> 0x3d) & 1;
                    pGVar10 = (Gia_Man_t *)CONCAT71(uVar19,uVar16 != 0x4000000000000000);
                    if (((bVar12 & uVar16 == 0x40000000) != 0) ||
                       (bVar12 == 0 && uVar16 == 0x4000000000000000)) {
                      uVar21 = uVar21 & 0xbfffffff3fffffff | 0x4000000000000000;
                      goto LAB_0059174b;
                    }
                  }
                  uVar21 = uVar21 | 0x4000000040000000;
                }
                else {
                  uVar21 = uVar21 & 0xbfffffff3fffffff | 0x40000000;
                }
LAB_0059174b:
                *(ulong *)(&pGVar5->field_0x0 + lVar15) = uVar21;
              }
              lVar22 = lVar22 + 1;
              lVar15 = lVar15 + 0xc;
            } while (lVar22 < p_00->nObjs);
          }
          pVVar14 = p_00->vCos;
          if (0 < pVVar14->nSize) {
            lVar15 = 0;
            do {
              iVar17 = pVVar14->pArray[lVar15];
              if (((long)iVar17 < 0) || (p_00->nObjs <= iVar17)) goto LAB_00591b36;
              pGVar10 = (Gia_Man_t *)p_00->pObjs;
              if (pGVar10 == (Gia_Man_t *)0x0) break;
              puVar1 = (ulong *)((long)&pGVar10->pName + (long)iVar17 * 0xc);
              uVar21 = *puVar1;
              uVar18 = (uint)uVar21;
              if ((-1 < (int)uVar18) || ((uVar18 & 0x1fffffff) == 0x1fffffff)) {
                __assert_fail("Gia_ObjIsCo(pObj)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x349,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
              }
              uVar13 = *(ulong *)((long)puVar1 + (ulong)(uVar18 & 0x1fffffff) * -0xc) &
                       0x4000000040000000;
              if (uVar13 == 0) {
                __assert_fail("!Gia_ObjTerSimGetC( Gia_ObjFanin0(pObj) )",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                              ,0x34a,"void Gia_ObjTerSimCo(Gia_Obj_t *)");
              }
              if ((((uVar18 >> 0x1d & 1) == 0) || (uVar13 != 0x4000000000000000)) &&
                 (((uVar18 >> 0x1d & 1) != 0 || (uVar13 != 0x40000000)))) {
                if ((((byte)(uVar21 >> 0x1d) & 1 & uVar13 == 0x40000000) == 0) &&
                   ((uVar21 >> 0x1d & 1) != 0 || uVar13 != 0x4000000000000000)) {
                  uVar21 = uVar21 | 0x4000000040000000;
                }
                else {
                  uVar21 = uVar21 & 0xbfffffffbfffffff | 0x4000000000000000;
                }
              }
              else {
                uVar21 = uVar21 & 0xbfffffffbfffffff | 0x40000000;
              }
              *puVar1 = uVar21;
              lVar15 = lVar15 + 1;
              pVVar14 = p_00->vCos;
              pGVar10 = (Gia_Man_t *)(long)pVVar14->nSize;
            } while (lVar15 < (long)pGVar10);
          }
          bVar8 = iVar9 < pCex->iFrame;
          iVar9 = iVar9 + 1;
        } while (bVar8);
      }
      iVar9 = p_00->vCos->nSize;
      if (iVar9 <= p_00->nRegs) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1b3,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (0 < iVar9) {
        iVar9 = *p_00->vCos->pArray;
        if (((long)iVar9 < 0) || (p_00->nObjs <= iVar9)) {
LAB_00591b36:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (((undefined1  [12])p_00->pObjs[iVar9] & (undefined1  [12])0x4000000040000000) ==
            (undefined1  [12])0x4000000000000000) {
          pGVar10 = p;
          pAVar11 = Gia_ManCexRemap(p,pCex,local_60);
          Abc_Print((int)pGVar10,"Procedure &gla_refine found a real counter-example in frame %d.\n"
                    ,(ulong)(uint)pAVar11->iFrame);
        }
        else {
          pAVar11 = (Abc_Cex_t *)0x0;
        }
        if (0 < p_00->nObjs) {
          lVar15 = 0;
          lVar22 = 0;
          do {
            if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
            puVar1 = (ulong *)(&p_00->pObjs->field_0x0 + lVar15);
            *puVar1 = *puVar1 & 0xbfffffffbfffffff;
            lVar22 = lVar22 + 1;
            lVar15 = lVar15 + 0xc;
          } while (lVar22 < p_00->nObjs);
        }
        if (pAVar11 == (Abc_Cex_t *)0x0) {
          if (0 < local_48->nSize) {
            piVar6 = local_48->pArray;
            pVVar14 = p->vGateClasses;
            pGVar10 = (Gia_Man_t *)0x0;
            do {
              lVar15 = (long)piVar6[(long)pGVar10];
              if ((lVar15 < 0) || (pVVar14->nSize <= piVar6[(long)pGVar10])) goto LAB_00591b55;
              piVar7 = pVVar14->pArray;
              if (piVar7[lVar15] != 0) {
                __assert_fail("Vec_IntEntry( p->vGateClasses, iObjId ) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOut.c"
                              ,0xac,"int Gia_ManGlaRefine(Gia_Man_t *, Abc_Cex_t *, int, int)");
              }
              piVar7[lVar15] = 1;
              pGVar10 = (Gia_Man_t *)((long)&pGVar10->pName + 1);
            } while ((long)pGVar10 < (long)local_48->nSize);
          }
          if (fVerbose != 0) {
            Abc_Print((int)pGVar10,"Additional objects = %d.  ");
            iVar17 = 3;
            iVar9 = clock_gettime(3,&local_40);
            if (iVar9 < 0) {
              lVar15 = -1;
            }
            else {
              lVar15 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
            }
            lVar15 = lVar15 + local_50;
            Abc_Print(iVar17,"%s =","Time");
            Abc_Print(iVar17,"%9.2f sec\n",(double)lVar15 / 1000000.0);
          }
        }
        if (local_60->pArray != (int *)0x0) {
          free(local_60->pArray);
          local_60->pArray = (int *)0x0;
        }
        if (local_60 != (Vec_Int_t *)0x0) {
          free(local_60);
        }
        if (local_48->pArray != (int *)0x0) {
          free(local_48->pArray);
          local_48->pArray = (int *)0x0;
        }
        if (local_48 != (Vec_Int_t *)0x0) {
          free(local_48);
        }
        Gia_ManStop(p_00);
        if (pAVar11 != (Abc_Cex_t *)0x0) {
          if (p->pCexSeq != (Abc_Cex_t *)0x0) {
            free(p->pCexSeq);
            p->pCexSeq = (Abc_Cex_t *)0x0;
          }
          p->pCexSeq = pAVar11;
          return 0;
        }
        if (local_54 == 0) {
          return -1;
        }
        Nwk_ManDeriveMinCut(p,fVerbose);
        return -1;
      }
LAB_00591b55:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Abc_Print((int)pGVar10,"Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n");
    Gia_ManStop(p_00);
  }
  return -1;
}

Assistant:

int Gia_ManGlaRefine( Gia_Man_t * p, Abc_Cex_t * pCex, int fMinCut, int fVerbose )
{
    extern void Nwk_ManDeriveMinCut( Gia_Man_t * p, int fVerbose );
    int fAddOneLayer = 1;
    Abc_Cex_t * pCexNew = NULL;
    Gia_Man_t * pAbs;
    Aig_Man_t * pAig;
    Abc_Cex_t * pCare;
    Vec_Int_t * vPis, * vPPis;
    int f, i, iObjId;
    abctime clk = Abc_Clock();
    int nOnes = 0, Counter = 0;
    if ( p->vGateClasses == NULL )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): Abstraction gate map is missing.\n" );
        return -1;
    }
    // derive abstraction
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    Gia_ManStop( pAbs );
    pAbs = Gia_ManDupAbsGates( p, p->vGateClasses );
    if ( Gia_ManPiNum(pAbs) != pCex->nPis )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The PI counts in GLA and in CEX do not match.\n" );
        Gia_ManStop( pAbs );
        return -1;
    }
    if ( !Gia_ManVerifyCex( pAbs, pCex, 0 ) )
    {
        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is invalid.\n" );
//        Gia_ManStop( pAbs );
//        return -1;
    }
//    else
//        Abc_Print( 1, "Gia_ManGlaRefine(): The initial counter-example is correct.\n" );
    // get inputs
    Gia_ManGlaCollect( p, p->vGateClasses, &vPis, &vPPis, NULL, NULL );
    assert( Vec_IntSize(vPis) + Vec_IntSize(vPPis) == Gia_ManPiNum(pAbs) );
    // add missing logic
    if ( fAddOneLayer )
    {
        Gia_Obj_t * pObj;
        // check if this is a real counter-example
        Gia_ObjTerSimSet0( Gia_ManConst0(pAbs) );
        for ( f = 0; f <= pCex->iFrame; f++ )
        {
            Gia_ManForEachPi( pAbs, pObj, i )
            {
                if ( i >= Vec_IntSize(vPis) ) // PPIs
                    Gia_ObjTerSimSetX( pObj );
                else if ( Abc_InfoHasBit(pCex->pData, pCex->nRegs + pCex->nPis * f + i) )
                    Gia_ObjTerSimSet1( pObj );
                else
                    Gia_ObjTerSimSet0( pObj );
            }
            Gia_ManForEachRo( pAbs, pObj, i )
            {
                if ( f == 0 )
                    Gia_ObjTerSimSet0( pObj );
                else
                    Gia_ObjTerSimRo( pAbs, pObj );
            }
            Gia_ManForEachAnd( pAbs, pObj, i )
                Gia_ObjTerSimAnd( pObj );
            Gia_ManForEachCo( pAbs, pObj, i )
                Gia_ObjTerSimCo( pObj );
        }
        pObj = Gia_ManPo( pAbs, 0 );
        if ( Gia_ObjTerSimGet1(pObj) )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
//        else
//            Abc_Print( 1, "CEX is not real.\n" );
        Gia_ManForEachObj( pAbs, pObj, i )
            Gia_ObjTerSimSetC( pObj );
        if ( pCexNew == NULL )
        {
            // grow one layer
            Vec_IntForEachEntry( vPPis, iObjId, i )
            {
                assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
            }
            if ( fVerbose )
            {
                Abc_Print( 1, "Additional objects = %d.  ", Vec_IntSize(vPPis) );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
        }
    }
    else
    {
        // minimize the CEX
        pAig = Gia_ManToAigSimple( pAbs );
        pCare = Saig_ManCbaFindCexCareBits( pAig, pCex, Vec_IntSize(vPis), fVerbose );
        Aig_ManStop( pAig );
        if ( pCare == NULL )
            Abc_Print( 1, "Counter-example minimization has failed.\n" );
        // add new objects to the map
        iObjId = -1;
        for ( f = 0; f <= pCare->iFrame; f++ )
            for ( i = 0; i < pCare->nPis; i++ )
                if ( Abc_InfoHasBit( pCare->pData, pCare->nRegs + f * pCare->nPis + i ) )
                {
                    nOnes++;
                    assert( i >= Vec_IntSize(vPis) );
                    iObjId = Vec_IntEntry( vPPis, i - Vec_IntSize(vPis) );
                    assert( iObjId > 0 && iObjId < Gia_ManObjNum(p) );
                    if ( Vec_IntEntry( p->vGateClasses, iObjId ) > 0 )
                        continue;
                    assert( Vec_IntEntry( p->vGateClasses, iObjId ) == 0 );
                    Vec_IntWriteEntry( p->vGateClasses, iObjId, 1 );
    //                Abc_Print( 1, "Adding object %d.\n", iObjId );
    //                Gia_ObjPrint( p, Gia_ManObj(p, iObjId) );
                    Counter++;
                }
        Abc_CexFree( pCare );
        if ( fVerbose )
        {
            Abc_Print( 1, "Essential bits = %d.  Additional objects = %d.  ", nOnes, Counter );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        // consider the case of SAT
        if ( iObjId == -1 )
        {
            pCexNew = Gia_ManCexRemap( p, pCex, vPis );
            Abc_Print( 1, "Procedure &gla_refine found a real counter-example in frame %d.\n", pCexNew->iFrame );
        }
    }
    Vec_IntFree( vPis );
    Vec_IntFree( vPPis );
    Gia_ManStop( pAbs );
    if ( pCexNew )
    {
        ABC_FREE( p->pCexSeq );
        p->pCexSeq = pCexNew;
        return 0;
    }
    // extract abstraction to include min-cut
    if ( fMinCut )
        Nwk_ManDeriveMinCut( p, fVerbose );
    return -1;
}